

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

Aig_Obj_t * Aig_ObjCreate(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Aig_Type_t AVar3;
  int Entry;
  Aig_Obj_t *pObj_00;
  float fVar4;
  float fVar5;
  float Prob1;
  float Prob0;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pGhost_local;
  Aig_Man_t *p_local;
  
  iVar2 = Aig_IsComplement(pGhost);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigObj.c"
                  ,0x5c,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjIsHash(pGhost);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsHash(pGhost)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigObj.c"
                  ,0x5d,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  pObj_00 = Aig_ManFetchMemory(p);
  *(ulong *)&pObj_00->field_0x18 =
       *(ulong *)&pObj_00->field_0x18 & 0xfffffffffffffff8 |
       (ulong)((uint)*(undefined8 *)&pGhost->field_0x18 & 7);
  Aig_ObjConnect(p,pObj_00,pGhost->pFanin0,pGhost->pFanin1);
  AVar3 = Aig_ObjType(pObj_00);
  p->nObjs[AVar3] = p->nObjs[AVar3] + 1;
  if ((pObj_00->field_5).pData != (void *)0x0) {
    __assert_fail("pObj->pData == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigObj.c"
                  ,0x66,"Aig_Obj_t *Aig_ObjCreate(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->vProbs != (Vec_Int_t *)0x0) {
    pVVar1 = p->vProbs;
    iVar2 = Aig_ObjFaninId0(pObj_00);
    iVar2 = Vec_IntEntry(pVVar1,iVar2);
    fVar4 = Abc_Int2Float(iVar2);
    pVVar1 = p->vProbs;
    iVar2 = Aig_ObjFaninId1(pObj_00);
    iVar2 = Vec_IntEntry(pVVar1,iVar2);
    fVar5 = Abc_Int2Float(iVar2);
    iVar2 = Aig_ObjFaninC0(pObj_00);
    if (iVar2 != 0) {
      fVar4 = 1.0 - fVar4;
    }
    iVar2 = Aig_ObjFaninC1(pObj_00);
    if (iVar2 != 0) {
      fVar5 = 1.0 - fVar5;
    }
    pVVar1 = p->vProbs;
    iVar2 = pObj_00->Id;
    Entry = Abc_Float2Int(fVar4 * fVar5);
    Vec_IntSetEntry(pVVar1,iVar2,Entry);
  }
  return pObj_00;
}

Assistant:

Aig_Obj_t * Aig_ObjCreate( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pObj;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsHash(pGhost) );
//    assert( pGhost == &p->Ghost );
    // get memory for the new object
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = pGhost->Type;
    // add connections
    Aig_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // update node counters of the manager
    p->nObjs[Aig_ObjType(pObj)]++;
    assert( pObj->pData == NULL );
    // create the power counter
    if ( p->vProbs )
    {
        float Prob0 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId0(pObj) ) );
        float Prob1 = Abc_Int2Float( Vec_IntEntry( p->vProbs, Aig_ObjFaninId1(pObj) ) );
        Prob0 = Aig_ObjFaninC0(pObj)? 1.0 - Prob0 : Prob0;
        Prob1 = Aig_ObjFaninC1(pObj)? 1.0 - Prob1 : Prob1;
        Vec_IntSetEntry( p->vProbs, pObj->Id, Abc_Float2Int(Prob0 * Prob1) );
    }
    return pObj;
}